

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O0

void __thiscall
EDLines::SplitSegment2Lines(EDLines *this,double *x,double *y,int noPixels,int segmentNo)

{
  double dVar1;
  LineSegment local_e0;
  int local_98;
  int local_94;
  int noSkippedPixels;
  int index_1;
  double ey;
  double ex;
  double sy;
  double sx;
  double d;
  int local_60;
  int badPixelCount;
  int goodPixelCount;
  int lastGoodIndex;
  int startIndex;
  int len;
  int index;
  int lastInvert;
  double error;
  double lastB;
  double lastA;
  int iStack_28;
  bool valid;
  int firstPixelIndex;
  int segmentNo_local;
  int noPixels_local;
  double *y_local;
  double *x_local;
  EDLines *this_local;
  
  lastA._4_4_ = 0;
  iStack_28 = segmentNo;
  firstPixelIndex = noPixels;
  _segmentNo_local = y;
  y_local = x;
  x_local = (double *)this;
  do {
    if (firstPixelIndex < this->min_line_len) {
      return;
    }
    lastA._3_1_ = 0;
    for (; this->min_line_len <= firstPixelIndex; firstPixelIndex = firstPixelIndex + -1) {
      LineFit(y_local,_segmentNo_local,this->min_line_len,&lastB,&error,(double *)&index,&len);
      if (_index <= 0.5) {
        lastA._3_1_ = 1;
        break;
      }
      y_local = y_local + 1;
      _segmentNo_local = _segmentNo_local + 1;
      lastA._4_4_ = lastA._4_4_ + 1;
    }
    if ((lastA._3_1_ & 1) == 0) {
      return;
    }
    startIndex = this->min_line_len;
    lastGoodIndex = this->min_line_len;
    do {
      if (firstPixelIndex <= startIndex) goto LAB_0012bfc8;
      goodPixelCount = startIndex;
      badPixelCount = startIndex + -1;
      local_60 = 0;
      d._4_4_ = 0;
      for (; startIndex < firstPixelIndex; startIndex = startIndex + 1) {
        sx = ComputeMinDistance(y_local[startIndex],_segmentNo_local[startIndex],lastB,error,len);
        if (this->line_error < sx) {
          d._4_4_ = d._4_4_ + 1;
          if (4 < d._4_4_) break;
        }
        else {
          badPixelCount = startIndex;
          local_60 = local_60 + 1;
          d._4_4_ = 0;
        }
      }
      if (1 < local_60) {
        lastGoodIndex = (badPixelCount - goodPixelCount) + 1 + lastGoodIndex;
        LineFit(y_local,_segmentNo_local,lastGoodIndex,&lastB,&error,len);
        startIndex = badPixelCount + 1;
      }
    } while ((1 < local_60) && (startIndex < firstPixelIndex));
    local_94 = 0;
    while (dVar1 = ComputeMinDistance(y_local[local_94],_segmentNo_local[local_94],lastB,error,len),
          this->line_error <= dVar1 && dVar1 != this->line_error) {
      local_94 = local_94 + 1;
    }
    ComputeClosestPoint(y_local[local_94],_segmentNo_local[local_94],lastB,error,len,&sy,&ex);
    local_98 = local_94;
    local_94 = badPixelCount;
    while (dVar1 = ComputeMinDistance(y_local[local_94],_segmentNo_local[local_94],lastB,error,len),
          this->line_error <= dVar1 && dVar1 != this->line_error) {
      local_94 = local_94 + -1;
    }
    ComputeClosestPoint(y_local[local_94],_segmentNo_local[local_94],lastB,error,len,&ey,
                        (double *)&noSkippedPixels);
    if (sy != ey || ex != _noSkippedPixels) {
      LineSegment::LineSegment
                (&local_e0,lastB,error,len,sy,ex,ey,_noSkippedPixels,iStack_28,
                 lastA._4_4_ + local_98,(local_94 - local_98) + 1);
      std::vector<LineSegment,_std::allocator<LineSegment>_>::push_back(&this->lines,&local_e0);
      this->linesNo = this->linesNo + 1;
      lastGoodIndex = local_94 + 1;
    }
LAB_0012bfc8:
    firstPixelIndex = firstPixelIndex - lastGoodIndex;
    y_local = y_local + lastGoodIndex;
    _segmentNo_local = _segmentNo_local + lastGoodIndex;
    lastA._4_4_ = lastGoodIndex + lastA._4_4_;
  } while( true );
}

Assistant:

void EDLines::SplitSegment2Lines(double * x, double * y, int noPixels, int segmentNo)
{

	// First pixel of the line segment within the segment of points
	int firstPixelIndex = 0;

	while (noPixels >= min_line_len) {
		// Start by fitting a line to MIN_LINE_LEN pixels
		bool valid = false;
		double lastA, lastB, error;
		int lastInvert;

		while (noPixels >= min_line_len) {
			LineFit(x, y, min_line_len, lastA, lastB, error, lastInvert);
			if (error <= 0.5) { valid = true; break; }

#if 1
			noPixels -= 1;   // Go slowly
			x += 1; y += 1;
			firstPixelIndex += 1;
#else
			noPixels -= 2;   // Go faster (for speed)
			x += 2; y += 2;
			firstPixelIndex += 2;
#endif
		} //end-while

		if (valid == false) return;

		// Now try to extend this line
		int index = min_line_len;
		int len = min_line_len;

		while (index < noPixels) {
			int startIndex = index;
			int lastGoodIndex = index - 1;
			int goodPixelCount = 0;
			int badPixelCount = 0;
			while (index < noPixels) {
				double d = ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert);

				if (d <= line_error) {
					lastGoodIndex = index;
					goodPixelCount++;
					badPixelCount = 0;

				}
				else {
					badPixelCount++;
					if (badPixelCount >= 5) break;
				} //end-if

				index++;
			} //end-while

			if (goodPixelCount >= 2) {
				len += lastGoodIndex - startIndex + 1;
				LineFit(x, y, len, lastA, lastB, lastInvert);  // faster LineFit
				index = lastGoodIndex + 1;
			} // end-if

			if (goodPixelCount < 2 || index >= noPixels) {
				// End of a line segment. Compute the end points
				double sx, sy, ex, ey;

				int index = 0;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index++;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, sx, sy);
				int noSkippedPixels = index;

				index = lastGoodIndex;
				while (ComputeMinDistance(x[index], y[index], lastA, lastB, lastInvert) > line_error) index--;
				ComputeClosestPoint(x[index], y[index], lastA, lastB, lastInvert, ex, ey);

				if ((sx == ex) & (sy == ey))
					break;

				// Add the line segment to lines
				lines.push_back(LineSegment(lastA, lastB, lastInvert, sx, sy, ex, ey, segmentNo, firstPixelIndex + noSkippedPixels, index - noSkippedPixels + 1));
				linesNo++;
				len = index + 1;
				break;
			} //end-else
		} //end-while

		noPixels -= len;
		x += len;
		y += len;
		firstPixelIndex += len;
	} //end-while
}